

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotBarsEx<ImPlot::GetterXsYs<int>>
               (char *label_id,GetterXsYs<int> *getter,double width)

{
  ImPlotNextItemData *col;
  bool bVar1;
  ImPlotContext *pIVar2;
  bool bVar3;
  ImU32 col_00;
  ImU32 col_01;
  ImDrawList *this;
  int i;
  int iVar4;
  int i_1;
  double dVar5;
  double y;
  ImPlotPoint IVar6;
  ImVec2 a;
  ImVec2 b;
  
  bVar3 = BeginItem(label_id,1);
  if (bVar3) {
    dVar5 = width * 0.5;
    if (GImPlot->FitThisFrame == true) {
      for (iVar4 = 0; iVar4 < getter->Count; iVar4 = iVar4 + 1) {
        IVar6 = GetterXsYs<int>::operator()(getter,iVar4);
        a = (ImVec2)(IVar6.x - dVar5);
        FitPoint((ImPlotPoint *)&a);
        a = (ImVec2)(IVar6.x + dVar5);
        FitPoint((ImPlotPoint *)&a);
      }
    }
    pIVar2 = GImPlot;
    col = &GImPlot->NextItemData;
    this = GetPlotDrawList();
    col_00 = ImGui::GetColorU32(col->Colors);
    col_01 = ImGui::GetColorU32((pIVar2->NextItemData).Colors + 1);
    bVar3 = (pIVar2->NextItemData).RenderFill;
    bVar1 = (pIVar2->NextItemData).RenderLine;
    for (iVar4 = 0; iVar4 < getter->Count; iVar4 = iVar4 + 1) {
      IVar6 = GetterXsYs<int>::operator()(getter,iVar4);
      y = IVar6.y;
      if ((y != 0.0) || (NAN(y))) {
        a = PlotToPixels(IVar6.x - dVar5,y,-1);
        b = PlotToPixels(IVar6.x + dVar5,0.0,-1);
        if ((pIVar2->NextItemData).RenderFill == true) {
          ImDrawList::AddRectFilled(this,&a,&b,col_01,0.0,0xf);
        }
        if (((col_00 != col_01 | bVar3 ^ 1U) & bVar1) != 0) {
          ImDrawList::AddRect(this,&a,&b,col_00,0.0,0xf,(pIVar2->NextItemData).LineWeight);
        }
      }
    }
    EndItem();
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawCornerFlags_All, s.LineWeight);
        }
        EndItem();
    }
}